

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ReturnStatement * __thiscall hdc::Parser::parse_return_statement(Parser *this)

{
  Token *pTVar1;
  TokenKind TVar2;
  ReturnStatement *this_00;
  Expression *expression;
  Token token;
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_38._M_p = (pointer)&local_28;
  expect(this,TK_RETURN);
  pTVar1 = (this->matched)._M_current;
  local_48._8_4_ = pTVar1->column;
  local_48._0_4_ = pTVar1->kind;
  local_48._4_4_ = pTVar1->line;
  std::__cxx11::string::_M_assign((string *)&local_38);
  TVar2 = Token::getKind((this->current_token)._M_current);
  if (TVar2 == TK_NEWLINE) {
    this_00 = (ReturnStatement *)operator_new(0x68);
    ReturnStatement::ReturnStatement(this_00,(Token *)local_48);
  }
  else {
    this_00 = (ReturnStatement *)operator_new(0x68);
    expression = parse_assignment_expression(this);
    ReturnStatement::ReturnStatement(this_00,(Token *)local_48,expression);
  }
  expect(this,TK_NEWLINE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p);
  }
  return this_00;
}

Assistant:

ReturnStatement* Parser::parse_return_statement() {
    Token token;
    ReturnStatement* ret;

    expect(TK_RETURN);
    token = *matched;

    if (lookahead(TK_NEWLINE)) {
        ret = new ReturnStatement(token);
    } else {
        ret = new ReturnStatement(token, parse_expression());
    }

    expect(TK_NEWLINE);
    return ret;
}